

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O0

jas_cmpxformseq_t * jas_cmpxformseq_copy(jas_cmpxformseq_t *pxformseq)

{
  int iVar1;
  jas_cmpxformseq_t *newpxformseq;
  jas_cmpxformseq_t *pxformseq_local;
  
  pxformseq_local = jas_cmpxformseq_create();
  if ((pxformseq_local == (jas_cmpxformseq_t *)0x0) ||
     (iVar1 = jas_cmpxformseq_append(pxformseq_local,pxformseq), iVar1 != 0)) {
    if (pxformseq_local != (jas_cmpxformseq_t *)0x0) {
      jas_cmpxformseq_destroy(pxformseq_local);
    }
    pxformseq_local = (jas_cmpxformseq_t *)0x0;
  }
  return pxformseq_local;
}

Assistant:

static jas_cmpxformseq_t *jas_cmpxformseq_copy(jas_cmpxformseq_t *pxformseq)
{
	jas_cmpxformseq_t *newpxformseq;

	if (!(newpxformseq = jas_cmpxformseq_create()))
		goto error;
	if (jas_cmpxformseq_append(newpxformseq, pxformseq))
		goto error;
	return newpxformseq;
error:
	if (newpxformseq)
		jas_cmpxformseq_destroy(newpxformseq);
	return 0;
}